

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

u8 * pageFindSlot(MemPage *pPg,int nByte,int *pRc)

{
  u32 uVar1;
  u8 *puVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  ushort uVar6;
  uint uVar7;
  uint uVar8;
  
  uVar4 = (ulong)pPg->hdrOffset;
  puVar2 = pPg->aData;
  uVar6 = *(ushort *)(puVar2 + uVar4 + 1) << 8 | *(ushort *)(puVar2 + uVar4 + 1) >> 8;
  uVar5 = uVar4 + 1;
  uVar1 = pPg->pBt->usableSize;
  while ((uVar7 = (uint)uVar6, (int)uVar7 <= (int)(uVar1 - 4) && ((int)uVar5 + 4U <= uVar7))) {
    uVar6 = *(ushort *)(puVar2 + (ulong)uVar7 + 2) << 8 |
            *(ushort *)(puVar2 + (ulong)uVar7 + 2) >> 8;
    uVar8 = (uint)uVar6 - nByte;
    if (-1 < (int)uVar8) {
      if (((uint)pPg->cellOffset + (uint)pPg->nCell * 2 <= uVar7) &&
         ((int)(uVar6 + uVar7) <= (int)uVar1)) {
        if (uVar8 < 4) {
          if (0x39 < puVar2[uVar4 + 7]) {
            return (u8 *)0x0;
          }
          *(undefined2 *)(puVar2 + uVar5) = *(undefined2 *)(puVar2 + uVar7);
          puVar2[uVar4 + 7] = puVar2[uVar4 + 7] + (char)uVar8;
        }
        else {
          *(ushort *)(puVar2 + (ulong)uVar7 + 2) = (ushort)uVar8 << 8 | (ushort)uVar8 >> 8;
        }
        return puVar2 + (uVar8 + uVar7);
      }
      iVar3 = 0xee82;
      goto LAB_00238620;
    }
    uVar6 = *(ushort *)(puVar2 + uVar7) << 8 | *(ushort *)(puVar2 + uVar7) >> 8;
    uVar5 = (ulong)uVar7;
    if (uVar6 == 0) {
      return (u8 *)0x0;
    }
  }
  iVar3 = 0xee77;
LAB_00238620:
  iVar3 = sqlite3CorruptError(iVar3);
  *pRc = iVar3;
  return (u8 *)0x0;
}

Assistant:

static u8 *pageFindSlot(MemPage *pPg, int nByte, int *pRc){
  const int hdr = pPg->hdrOffset;
  u8 * const aData = pPg->aData;
  int iAddr = hdr + 1;
  int pc = get2byte(&aData[iAddr]);
  int x;
  int usableSize = pPg->pBt->usableSize;

  assert( pc>0 );
  do{
    int size;            /* Size of the free slot */
    /* EVIDENCE-OF: R-06866-39125 Freeblocks are always connected in order of
    ** increasing offset. */
    if( pc>usableSize-4 || pc<iAddr+4 ){
      *pRc = SQLITE_CORRUPT_PGNO(pPg->pgno);
      return 0;
    }
    /* EVIDENCE-OF: R-22710-53328 The third and fourth bytes of each
    ** freeblock form a big-endian integer which is the size of the freeblock
    ** in bytes, including the 4-byte header. */
    size = get2byte(&aData[pc+2]);
    if( (x = size - nByte)>=0 ){
      testcase( x==4 );
      testcase( x==3 );
      if( pc < pPg->cellOffset+2*pPg->nCell || size+pc > usableSize ){
        *pRc = SQLITE_CORRUPT_PGNO(pPg->pgno);
        return 0;
      }else if( x<4 ){
        /* EVIDENCE-OF: R-11498-58022 In a well-formed b-tree page, the total
        ** number of bytes in fragments may not exceed 60. */
        if( aData[hdr+7]>57 ) return 0;

        /* Remove the slot from the free-list. Update the number of
        ** fragmented bytes within the page. */
        memcpy(&aData[iAddr], &aData[pc], 2);
        aData[hdr+7] += (u8)x;
      }else{
        /* The slot remains on the free-list. Reduce its size to account
         ** for the portion used by the new allocation. */
        put2byte(&aData[pc+2], x);
      }
      return &aData[pc + x];
    }
    iAddr = pc;
    pc = get2byte(&aData[pc]);
  }while( pc );

  return 0;
}